

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>::Invoke
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
          *this,CommissionerDataset *args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  local_30;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  holder;
  ArgumentTuple tuple;
  CommissionerDataset *args_local;
  FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
  *this_local;
  
  std::tuple<const_ot::commissioner::CommissionerDataset_&>::tuple<true,_true>
            ((tuple<const_ot::commissioner::CommissionerDataset_&> *)&holder,args);
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
              *)&local_30,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
            ::operator->(&local_30);
  ActionResultHolder<ot::commissioner::Error>::Unwrap(__return_storage_ptr__,this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  ::~unique_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }